

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O2

int Storage::Tape::MSX::Parser::get_byte(FileSpeed *speed,BinaryTapePlayer *tape_player)

{
  uint uVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  IntType IVar5;
  IntType IVar6;
  int iVar7;
  byte bVar8;
  float fVar9;
  float fVar10;
  float local_58;
  uint local_54;
  _func_int **local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  float local_3c;
  float local_38;
  int local_34;
  
  bVar2 = BinaryTapePlayer::get_motor_control(tape_player);
  if (bVar2) {
    local_3c = (float)speed->minimum_start_bit_duration * 1.145e-05 * 0.5;
    bVar8 = 0;
    do {
      TapePlayer::get_tape((TapePlayer *)&local_50);
      cVar3 = (**(code **)*local_50)();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
      if (cVar3 != '\0') break;
      bVar2 = BinaryTapePlayer::get_input(tape_player);
      local_58 = 0.0;
      while (bVar4 = BinaryTapePlayer::get_input(tape_player), bVar2 == bVar4) {
        IVar5 = TimedEventLoop::get_cycles_until_next_event((TimedEventLoop *)tape_player);
        IVar6 = TimedEventLoop::get_input_clock_rate((TimedEventLoop *)tape_player);
        local_58 = local_58 + (float)IVar5 / (float)IVar6;
        TapePlayer::run_for_input_pulse(&tape_player->super_TapePlayer);
      }
      bVar8 = (local_3c <= local_58) + bVar8 * '\x02';
    } while ((~bVar8 & 3) != 0);
    bVar8 = speed->low_high_disrimination_duration;
    IVar5 = TimedEventLoop::get_input_clock_rate((TimedEventLoop *)tape_player);
    local_38 = (float)(int)((float)IVar5 * (float)bVar8 * 1.73e-05 + 0.5);
    local_58._0_1_ = BinaryTapePlayer::get_input(tape_player);
    fVar9 = 0.0;
    iVar7 = 8;
    do {
      TapePlayer::get_tape((TapePlayer *)&local_50);
      cVar3 = (**(code **)*local_50)();
      if (cVar3 != '\0') {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
        return (int)fVar9;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
      local_34 = iVar7 + -1;
      if (iVar7 == 0) {
        return (int)fVar9;
      }
      local_54 = 0;
      fVar10 = local_38;
      local_3c = fVar9;
      while( true ) {
        TapePlayer::get_tape((TapePlayer *)&local_50);
        cVar3 = (**(code **)*local_50)();
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
        if (cVar3 != '\0' || fVar10 == 0.0) break;
        IVar5 = TimedEventLoop::get_cycles_until_next_event((TimedEventLoop *)tape_player);
        fVar9 = (float)IVar5;
        if ((int)fVar10 < (int)(float)IVar5) {
          fVar9 = fVar10;
        }
        fVar10 = (float)((int)fVar10 - (int)fVar9);
        BinaryTapePlayer::run_for(tape_player,(Cycles)(long)(int)fVar9);
        bVar2 = BinaryTapePlayer::get_input(tape_player);
        if (bVar2 != local_58._0_1_) {
          local_58._0_1_ = BinaryTapePlayer::get_input(tape_player);
          local_54 = local_54 + 1;
        }
      }
      TapePlayer::get_tape((TapePlayer *)&local_50);
      cVar3 = (**(code **)*local_50)();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
      if (cVar3 != '\0' || 3 < local_54) {
        return -1;
      }
      fVar9 = (float)((uint)local_3c >> 1 | *(uint *)(&DAT_0047f974 + (ulong)local_54 * 4));
      local_54 = local_54 & 0xffffff01;
      do {
        do {
          TapePlayer::get_tape((TapePlayer *)&local_50);
          cVar3 = (**(code **)*local_50)();
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
          if (cVar3 != '\0') goto LAB_003eff4a;
          TapePlayer::run_for_input_pulse(&tape_player->super_TapePlayer);
          bVar2 = BinaryTapePlayer::get_input(tape_player);
        } while (bVar2 == local_58._0_1_);
        local_58._0_1_ = BinaryTapePlayer::get_input(tape_player);
        uVar1 = local_54 & 1;
        local_54 = 1;
      } while (uVar1 == 0);
LAB_003eff4a:
      TapePlayer::get_tape((TapePlayer *)&local_50);
      cVar3 = (**(code **)*local_50)();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
      iVar7 = local_34;
    } while (cVar3 == '\0');
  }
  return -1;
}

Assistant:

int Parser::get_byte(const FileSpeed &speed, Storage::Tape::BinaryTapePlayer &tape_player) {
	if(!tape_player.get_motor_control()) {
		return -1;
	}

	/*
		"The cassette is first read continuously until a start bit is found.
		This is done by locating a negative transition, measuring the following
		cycle length (1B1FH) and comparing this to see if it is greater than LOWLIM."

		... but I don't buy that, as it makes the process overly dependent on phase.
		So I'm going to look for the next two consecutive pulses that are each big
		enough to be half of a zero.
	*/
	const float minimum_start_bit_duration = float(speed.minimum_start_bit_duration) * 0.00001145f * 0.5f;
	int input = 0;
	while(!tape_player.get_tape()->is_at_end()) {
		// Find next transition.
		bool level = tape_player.get_input();
		float duration = 0.0;
		while(level == tape_player.get_input()) {
			duration += float(tape_player.get_cycles_until_next_event()) / float(tape_player.get_input_clock_rate());
			tape_player.run_for_input_pulse();
		}

		input = (input << 1);
		if(duration >= minimum_start_bit_duration) input |= 1;
		if((input&3) == 3) break;
	}

	/*
		"Each of the eight data bits is then read by counting the number of transitions within
		a fixed period of time (1B03H). If zero or one transitions are found it is a 0 bit, if two
		or three are found it is a 1 bit. If more than three transitions are found the routine
		terminates with Flag C as this is presumed to be a hardware error of some sort."
	*/
	int result = 0;
	const int cycles_per_window = int(
		0.5f +
		float(speed.low_high_disrimination_duration) *
		0.0000173f *
		float(tape_player.get_input_clock_rate())
	);
	int bits_left = 8;
	bool level = tape_player.get_input();
	while(!tape_player.get_tape()->is_at_end() && bits_left--) {
		// Count number of transitions within cycles_per_window.
		int transitions = 0;
		int cycles_remaining = cycles_per_window;
		while(!tape_player.get_tape()->is_at_end() && cycles_remaining) {
			const int cycles_until_next_event = int(tape_player.get_cycles_until_next_event());
			const int cycles_to_run_for = std::min(cycles_until_next_event, cycles_remaining);

			cycles_remaining -= cycles_to_run_for;
			tape_player.run_for(Cycles(cycles_to_run_for));

			if(level != tape_player.get_input()) {
				level = tape_player.get_input();
				transitions++;
			}
		}

		if(tape_player.get_tape()->is_at_end()) return -1;

		int next_bit = 0;
		switch(transitions) {
			case 0: case 1:
				next_bit = 0x00;
			break;
			case 2: case 3:
				next_bit = 0x80;
			break;
			default:
			return -1;
		}
		result = (result >> 1) | next_bit;

		/*
			"After the value of each bit has been determined a further one or two transitions are read (1B23H)
			to retain synchronization. With an odd transition count one more will be read, with an even
			transition count two more."
		*/
		int required_transitions = 2 - (transitions&1);
		while(!tape_player.get_tape()->is_at_end()) {
			tape_player.run_for_input_pulse();
			if(level != tape_player.get_input()) {
				level = tape_player.get_input();
				required_transitions--;
				if(!required_transitions) break;
			}
		}

		if(tape_player.get_tape()->is_at_end()) return -1;
	}
	return result;
}